

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

PropertyId Js::JavascriptOperators::GetPropertyId(Var propertyName,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptSymbol *pJVar2;
  JavascriptSymbolObject *pJVar3;
  JavascriptString *propertyString;
  PropertyRecord *local_20;
  PropertyRecord *propertyRecord;
  
  local_20 = (PropertyRecord *)0x0;
  bVar1 = VarIs<Js::JavascriptSymbol>(propertyName);
  if (bVar1) {
    pJVar2 = UnsafeVarTo<Js::JavascriptSymbol>(propertyName);
  }
  else {
    pJVar2 = (JavascriptSymbol *)0x0;
  }
  if (pJVar2 == (JavascriptSymbol *)0x0) {
    bVar1 = VarIs<Js::JavascriptSymbolObject>(propertyName);
    if (bVar1) {
      pJVar3 = UnsafeVarTo<Js::JavascriptSymbolObject>(propertyName);
    }
    else {
      pJVar3 = (JavascriptSymbolObject *)0x0;
    }
    if (pJVar3 == (JavascriptSymbolObject *)0x0) {
      propertyString = JavascriptConversion::ToString(propertyName,scriptContext);
      ScriptContext::GetOrAddPropertyRecord(scriptContext,propertyString,&local_20);
      goto LAB_00ab55a9;
    }
    pJVar2 = (pJVar3->value).ptr;
    if (pJVar2 == (JavascriptSymbol *)0x0) {
      local_20 = (PropertyRecord *)0x0;
      goto LAB_00ab55a9;
    }
  }
  local_20 = (pJVar2->propertyRecordUsageCache).propertyRecord.ptr;
LAB_00ab55a9:
  return local_20->pid;
}

Assistant:

Js::PropertyId JavascriptOperators::GetPropertyId(Var propertyName, ScriptContext* scriptContext)
    {
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptSymbol * symbol = JavascriptOperators::TryFromVar<Js::JavascriptSymbol>(propertyName);
        if (symbol)
        {
            propertyRecord = symbol->GetValue();
        }
        else
        {
            JavascriptSymbolObject * symbolObject = JavascriptOperators::TryFromVar<JavascriptSymbolObject>(propertyName);
            if (symbolObject)
            {
                propertyRecord = symbolObject->GetValue();
            }
            else
            {
                JavascriptString * indexStr = JavascriptConversion::ToString(propertyName, scriptContext);
                scriptContext->GetOrAddPropertyRecord(indexStr, &propertyRecord);
            }
        }

        return propertyRecord->GetPropertyId();
    }